

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultConverters.cpp
# Opt level: O3

void genericCU16toCF32(void *srcBuff,void *dstBuff,size_t numElems,double scaler)

{
  long lVar1;
  
  if (numElems * 2 != 0) {
    lVar1 = 0;
    do {
      *(float *)((long)dstBuff + lVar1 * 4) =
           (float)((double)((float)(int)(short)(*(ushort *)((long)srcBuff + lVar1 * 2) ^ 0x8000) /
                           32767.0) * scaler);
      lVar1 = lVar1 + 1;
    } while (numElems * 2 != lVar1);
  }
  return;
}

Assistant:

static void genericCU16toCF32(const void *srcBuff, void *dstBuff, const size_t numElems, const double scaler)
{
  const size_t elemDepth = 2;

  auto *src = (uint16_t*)srcBuff;
  auto *dst = (float*)dstBuff;
  for (size_t i = 0; i < numElems*elemDepth; i++)
    {
      dst[i] = SoapySDR::U16toF32(src[i]) * scaler;
    }
}